

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_ed25519_asn1.cc
# Opt level: O3

int ed25519_priv_encode(CBB *out,EVP_PKEY *pkey)

{
  uint8_t *data;
  int iVar1;
  int line;
  CBB pkcs8;
  CBB inner;
  CBB private_key;
  CBB algorithm;
  CBB local_d0;
  CBB local_a0;
  CBB local_70;
  CBB local_40;
  
  data = (uint8_t *)pkey->pkey;
  if (data[0x40] == '\0') {
    iVar1 = 0x82;
    line = 0xae;
  }
  else {
    iVar1 = CBB_add_asn1(out,&local_d0,0x20000010);
    if (((((iVar1 != 0) && (iVar1 = CBB_add_asn1_uint64(&local_d0,0), iVar1 != 0)) &&
         (iVar1 = CBB_add_asn1(&local_d0,&local_40,0x20000010), iVar1 != 0)) &&
        ((iVar1 = CBB_add_asn1_element(&local_40,6,ed25519_asn1_meth.oid,3), iVar1 != 0 &&
         (iVar1 = CBB_add_asn1(&local_d0,&local_70,4), iVar1 != 0)))) &&
       ((iVar1 = CBB_add_asn1(&local_70,&local_a0,4), iVar1 != 0 &&
        ((iVar1 = CBB_add_bytes(&local_a0,data,0x20), iVar1 != 0 &&
         (iVar1 = CBB_flush(out), iVar1 != 0)))))) {
      return 1;
    }
    iVar1 = 0x69;
    line = 0xbf;
  }
  ERR_put_error(6,0,iVar1,
                "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/evp/p_ed25519_asn1.cc"
                ,line);
  return 0;
}

Assistant:

static int ed25519_priv_encode(CBB *out, const EVP_PKEY *pkey) {
  const ED25519_KEY *key = reinterpret_cast<const ED25519_KEY *>(pkey->pkey);
  if (!key->has_private) {
    OPENSSL_PUT_ERROR(EVP, EVP_R_NOT_A_PRIVATE_KEY);
    return 0;
  }

  // See RFC 8410, section 7.
  CBB pkcs8, algorithm, private_key, inner;
  if (!CBB_add_asn1(out, &pkcs8, CBS_ASN1_SEQUENCE) ||
      !CBB_add_asn1_uint64(&pkcs8, 0 /* version */) ||
      !CBB_add_asn1(&pkcs8, &algorithm, CBS_ASN1_SEQUENCE) ||
      !CBB_add_asn1_element(&algorithm, CBS_ASN1_OBJECT, ed25519_asn1_meth.oid,
                            ed25519_asn1_meth.oid_len) ||
      !CBB_add_asn1(&pkcs8, &private_key, CBS_ASN1_OCTETSTRING) ||
      !CBB_add_asn1(&private_key, &inner, CBS_ASN1_OCTETSTRING) ||
      // The PKCS#8 encoding stores only the 32-byte seed which is the first 32
      // bytes of the private key.
      !CBB_add_bytes(&inner, key->key, 32) ||  //
      !CBB_flush(out)) {
    OPENSSL_PUT_ERROR(EVP, EVP_R_ENCODE_ERROR);
    return 0;
  }

  return 1;
}